

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-select.cc
# Opt level: O2

void __thiscall
dynet::PickBatchElements::backward_dev_impl<dynet::Device_CPU>
          (PickBatchElements *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  uint uVar1;
  ulong uVar2;
  DefaultDevice *local_c8;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *local_c0;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> local_b8;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_a0;
  long local_90;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> local_88;
  ulong local_70;
  TensorChippingOp<1L,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>
  local_58;
  
  if (this->pval == (uint *)0x0) {
    for (uVar1 = 0; uVar2 = (ulong)uVar1,
        uVar2 < (ulong)((long)(this->pvals->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->pvals->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start >> 2); uVar1 = uVar1 + 1) {
      Tensor::tbvec((TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *)&local_a0,
                    dEdf);
      local_58.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] = local_90;
      local_58.m_xpr.m_data = local_a0.m_data;
      local_58.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
           (long)local_a0.m_dimensions.super_array<long,_1>._M_elems[0];
      local_58.m_offset = uVar2;
      Tensor::tbvec(&local_b8,dEdxi);
      local_70 = (ulong)(this->pvals->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar2];
      local_88.m_dimensions.super_array<long,_2>._M_elems[1] =
           local_b8.m_dimensions.super_array<long,_2>._M_elems[1];
      local_88.m_data = local_b8.m_data;
      local_88.m_dimensions.super_array<long,_2>._M_elems[0] =
           local_b8.m_dimensions.super_array<long,_2>._M_elems[0];
      local_c8 = dev->edevice;
      local_c0 = &local_88;
      Eigen::
      TensorDevice<Eigen::TensorChippingOp<1l,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
      ::operator+=((TensorDevice<Eigen::TensorChippingOp<1l,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
                    *)&local_c8,&local_58);
    }
  }
  else {
    local_a0 = Tensor::tvec(dEdf);
    Tensor::tbvec(&local_88,dEdxi);
    local_58.m_offset = (Index)*this->pval;
    local_b8.m_dimensions.super_array<long,_2>._M_elems[0] = (long)&local_58;
    local_58.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
         local_88.m_dimensions.super_array<long,_2>._M_elems[1];
    local_58.m_xpr.m_data = local_88.m_data;
    local_58.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
         local_88.m_dimensions.super_array<long,_2>._M_elems[0];
    local_b8.m_data = (StoragePointerType)dev->edevice;
    Eigen::
    TensorDevice<Eigen::TensorChippingOp<1l,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
    ::operator+=((TensorDevice<Eigen::TensorChippingOp<1l,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
                  *)&local_b8,&local_a0);
  }
  return;
}

Assistant:

void PickBatchElements::backward_dev_impl(const MyDevice & dev,
                                  const vector<const Tensor*>& xs,
                                  const Tensor& fx,
                                  const Tensor& dEdf,
                                  unsigned i,
                                  Tensor& dEdxi) const {
  DYNET_ASSERT(i == 0, "Failed dimension check in PickBatchElements::backward");
  if (pval) {
    dEdxi.tbvec().chip<1>(*pval).device(*dev.edevice) += dEdf.tvec();
  } else {
    DYNET_ASSERT(pvals, "Neither single nor vector of elements available in PickBatchElements::backward");
    for (unsigned b = 0; b < pvals->size(); ++b)
      dEdxi.tbvec().chip<1>((*pvals)[b]).device(*dev.edevice) += dEdf.tbvec().chip<1>(b);
  }
}